

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

double __thiscall ON_SubDMatrix::TestEvaluation(ON_SubDMatrix *this)

{
  ON_3dPoint *this_00;
  ON_SubDComponentPtr *pOVar1;
  ON_SubDComponentPtr *this_01;
  ON_3dPoint *pOVar2;
  bool bVar3;
  uint vi;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ON_SubD *pOVar8;
  ON_SubDVertex *pOVar9;
  ON_SubDVertex *pOVar10;
  ulong uVar11;
  ON_3dPoint *this_02;
  ON_SubDEdge *this_03;
  ON_SubDFace *this_04;
  double *pdVar12;
  ON_3dPoint *p;
  int line_number;
  uint j;
  ulong uVar13;
  uint i;
  ulong c;
  ulong uVar14;
  ON_3dPoint *pOVar15;
  double dVar16;
  double dVar17;
  ulong local_240;
  double local_238;
  ulong local_230;
  ON_3dPoint *local_220;
  uint SP_low_precision_index;
  ON_3dPoint *local_208;
  char *local_200;
  ON_SubDVertex **local_1f8;
  ulong local_1f0;
  double **local_1e8;
  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  double N_Scol_precision [3];
  ON_SimpleArray<ON_3dPoint> _ringP1;
  ON_SimpleArray<ON_3dPoint> _ringP0;
  ON_SimpleArray<const_ON_SubDVertex_*> vertex_ring_array;
  double N_outer_point_precision [3];
  double N_vertex_point_precision [3];
  ON_SimpleArray<double> _Scol;
  ON_SubD subd;
  ON_SimpleArray<ON_3dPoint> _P;
  ON_3dPoint local_a8;
  ON_3dVector local_90;
  ON_SubDSectorIterator sit;
  
  if (((((this->m_S == (double **)0x0) || (this->m_R < 3)) ||
       (bVar3 = ON_SubDSectorType::IsValid(&this->m_sector_type), !bVar3)) ||
      ((uVar4 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar4 == 0 ||
       (uVar5 = ON_SubDSectorType::EdgeCount(&this->m_sector_type), uVar5 == 0)))) ||
     ((uVar6 = ON_SubDSectorType::PointRingCount(&this->m_sector_type), uVar6 == 0 ||
      ((uVar6 != this->m_R ||
       (uVar7 = ON_SubDSectorType::FacetEdgeCount(&this->m_sector_type), uVar7 == 0)))))) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  local_238 = TestMatrix(this);
  local_1e8 = this->m_S;
  SP_low_precision_index = 0xffffffff;
  c = (ulong)uVar6;
  ON_SimpleArray<ON_3dPoint>::ON_SimpleArray(&_P,c);
  local_208 = _P.m_a;
  ON_SimpleArray<double>::ON_SimpleArray(&_Scol,c);
  ON_SubD::ON_SubD(&subd);
  pOVar8 = ON_SubDSectorType::SectorRingSubD(&this->m_sector_type,0.0,0.0,&subd);
  if (&subd == pOVar8) {
    pOVar9 = ON_SubD::FirstVertex(&subd);
    if (((pOVar9 == (ON_SubDVertex *)0x0) || (uVar5 != pOVar9->m_edge_count)) ||
       (uVar4 != pOVar9->m_face_count)) {
      ON_SubDIncrementErrorCount();
    }
    else {
      sit.m_current_fei[0] = 0;
      sit.m_current_fei[1] = 0;
      sit.m_initial_face_dir = 0;
      sit.m_current_face_dir = 0;
      sit.m_current_eptr[1].m_ptr = 0;
      sit.m_initial_fvi = 0;
      sit.m_current_fvi = 0;
      sit.m_current_face = (ON_SubDFace *)0x0;
      sit.m_current_eptr[0].m_ptr = 0;
      sit.m_center_vertex = (ON_SubDVertex *)0x0;
      sit.m_initial_face = (ON_SubDFace *)0x0;
      sit.m_current_ring_index = 0;
      pOVar10 = ON_SubDSectorIterator::Initialize(&sit,pOVar9);
      if (pOVar10 != (ON_SubDVertex *)0x0) {
        uVar4 = ON_SubD::VertexCount(&subd);
        ON_SimpleArray<const_ON_SubDVertex_*>::ON_SimpleArray(&vertex_ring_array,(ulong)uVar4);
        while (component_ring_array._vptr_ON_SimpleArray = (_func_int **)pOVar9,
              pOVar9 != (ON_SubDVertex *)0x0) {
          ON_SimpleArray<const_ON_SubDVertex_*>::Append
                    (&vertex_ring_array,(ON_SubDVertex **)&component_ring_array);
          pOVar9 = (ON_SubDVertex *)component_ring_array._vptr_ON_SimpleArray[0xb];
        }
        if (uVar6 == vertex_ring_array.m_count) {
          component_ring_array._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0082ba60;
          component_ring_array.m_a = (ON_SubDComponentPtr *)0x0;
          component_ring_array.m_count = 0;
          component_ring_array.m_capacity = 0;
          uVar4 = ON_SubD::GetSectorComponentRing(&sit,&component_ring_array);
          if ((uVar4 < 4) ||
             (uVar5 = ON_SubDSectorType::ComponentRingCount(&this->m_sector_type),
             this_01 = component_ring_array.m_a, dVar16 = ON_DBL_QNAN, uVar4 != uVar5)) {
            ON_SubDIncrementErrorCount();
            local_238 = -1.23432101234321e+308;
          }
          else {
            local_1f8 = vertex_ring_array.m_a;
            _ringP0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081b0f0;
            _ringP0.m_a = (ON_3dPoint *)0x0;
            _ringP0.m_count = 0;
            _ringP0.m_capacity = 0;
            _ringP1._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081b0f0;
            _ringP1.m_a = (ON_3dPoint *)0x0;
            _ringP1.m_count = 0;
            _ringP1.m_capacity = 0;
            for (uVar11 = 0; c != uVar11; uVar11 = uVar11 + 1) {
              _Scol.m_a[uVar11] = dVar16;
            }
            local_1f0 = (ulong)uVar4;
            local_200 = "x,y,z vertex point precisions are not identical.";
            for (local_230 = 0; local_230 != c; local_230 = local_230 + 1) {
              N_vertex_point_precision[2] = 0.0;
              N_vertex_point_precision[0] = 0.0;
              N_vertex_point_precision[1] = 0.0;
              N_outer_point_precision[2] = 0.0;
              N_outer_point_precision[0] = 0.0;
              N_outer_point_precision[1] = 0.0;
              N_Scol_precision[2] = 0.0;
              N_Scol_precision[0] = 0.0;
              N_Scol_precision[1] = 0.0;
              this_02 = local_208 + local_230;
              local_240 = 0;
              while (uVar11 = local_1f0, local_240 != 3) {
                if ((this_01 == (ON_SubDComponentPtr *)0x0) ||
                   (pOVar9 = ON_SubDComponentPtr::Vertex(this_01), pOVar9 == (ON_SubDVertex *)0x0))
                {
LAB_006030eb:
                  ON_SubDIncrementErrorCount();
LAB_006030f0:
                  ON_SubDIncrementErrorCount();
LAB_006030fc:
                  local_238 = -1.23432101234321e+308;
                  goto LAB_0060310a;
                }
                ON_SubDVertex::ClearSavedSubdivisionPoints(pOVar9);
                pOVar1 = this_01;
                for (uVar14 = 1; uVar14 < uVar11; uVar14 = uVar14 + 2) {
                  this_03 = ON_SubDComponentPtr::Edge(pOVar1 + 1);
                  if (this_03 == (ON_SubDEdge *)0x0) goto LAB_006030eb;
                  ON_SubDComponentBase::Internal_ClearSubdivisionPointAndSurfacePointFlags
                            (&this_03->super_ON_SubDComponentBase);
                  if (uVar11 <= uVar14 + 1) break;
                  this_04 = ON_SubDComponentPtr::Face(pOVar1 + 2);
                  if (this_04 == (ON_SubDFace *)0x0) goto LAB_006030eb;
                  ON_SubDComponentBase::Internal_ClearSubdivisionPointAndSurfacePointFlags
                            (&this_04->super_ON_SubDComponentBase);
                  pOVar1 = pOVar1 + 2;
                }
                local_1f8[local_230]->m_P[local_240] = 1.0;
                uVar4 = ON_SubD::GetSectorPointRing(false,uVar11,this_01,&_ringP0);
                pOVar2 = _ringP0.m_a;
                if (uVar6 != uVar4) goto LAB_006030f0;
                uVar11 = local_240 + 1;
                uVar4 = (uint)local_240;
                uVar14 = 0;
                pOVar15 = _ringP0.m_a;
                while (c != uVar14) {
                  dVar16 = ON_3dPoint::operator[](pOVar15,(uint)((uVar11 & 0xffffffff) % 3));
                  if ((dVar16 != 0.0) || (NAN(dVar16))) goto LAB_006030f7;
                  dVar16 = ON_3dPoint::operator[](pOVar15,(uVar4 + 2) % 3);
                  if ((dVar16 != 0.0) || (NAN(dVar16))) goto LAB_006030f7;
                  dVar16 = ON_3dPoint::operator[](pOVar15,uVar4);
                  dVar17 = 1.0;
                  if (local_230 != uVar14) {
                    dVar17 = 0.0;
                  }
                  uVar14 = uVar14 + 1;
                  pOVar15 = pOVar15 + 1;
                  if ((dVar16 != dVar17) || (NAN(dVar16) || NAN(dVar17))) {
LAB_006030f7:
                    ON_SubDIncrementErrorCount();
                    goto LAB_006030fc;
                  }
                }
                uVar5 = ON_SubD::GetSectorSubdivisionPointRing(this_01,local_1f0,&_ringP1);
                pOVar15 = _ringP1.m_a;
                if (uVar6 != uVar5) {
                  ON_SubDIncrementErrorCount();
                  goto LAB_006030fc;
                }
                local_220 = _ringP1.m_a;
                for (uVar14 = 0; uVar14 != c; uVar14 = uVar14 + 1) {
                  this_00 = local_208 + uVar14;
                  local_208[uVar14].z = ON_3dPoint::Origin.z;
                  dVar16 = ON_3dPoint::Origin.y;
                  local_208[uVar14].x = ON_3dPoint::Origin.x;
                  local_208[uVar14].y = dVar16;
                  p = pOVar2;
                  for (uVar13 = 0; c != uVar13; uVar13 = uVar13 + 1) {
                    ::operator*(&local_a8,local_1e8[uVar14][uVar13],p);
                    ON_3dVector::ON_3dVector(&local_90,&local_a8);
                    ON_3dPoint::operator+=(this_00,&local_90);
                    p = p + 1;
                  }
                }
                pdVar12 = ON_3dPoint::operator[](this_02,uVar4);
                if ((*pdVar12 <= 0.0) ||
                   (bVar3 = TestPoint(local_208,0,*pOVar15,uVar4,N_vertex_point_precision,
                                      &SP_low_precision_index), !bVar3)) {
LAB_0060318e:
                  ON_SubDIncrementErrorCount();
                  goto LAB_006030fc;
                }
                uVar14 = 1;
                while (pOVar15 = pOVar15 + 1, c != uVar14) {
                  bVar3 = TestPoint(local_208,(uint)uVar14,*pOVar15,uVar4,N_outer_point_precision,
                                    &SP_low_precision_index);
                  uVar14 = uVar14 + 1;
                  if (!bVar3) {
                    ON_SubDIncrementErrorCount();
                    goto LAB_006030fc;
                  }
                }
                for (uVar14 = 0; c != uVar14; uVar14 = uVar14 + 1) {
                  dVar16 = local_1e8[uVar14][local_230];
                  dVar17 = ON_3dPoint::operator[](local_220,uVar4);
                  dVar16 = ABS(dVar16 - dVar17);
                  if (N_Scol_precision[local_240] <= dVar16 && dVar16 != N_Scol_precision[local_240]
                     ) {
                    N_Scol_precision[local_240] = dVar16;
                  }
                  local_220 = local_220 + 1;
                }
                if ((N_vertex_point_precision[0] != N_vertex_point_precision[local_240]) ||
                   (NAN(N_vertex_point_precision[0]) || NAN(N_vertex_point_precision[local_240]))) {
                  line_number = 0x19c;
LAB_00603174:
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                             ,line_number,"",local_200);
                  goto LAB_0060318e;
                }
                if ((N_outer_point_precision[0] != N_outer_point_precision[local_240]) ||
                   (NAN(N_outer_point_precision[0]) || NAN(N_outer_point_precision[local_240]))) {
                  line_number = 0x1a1;
                  local_200 = "x,y,z outer point precisions are not identical.";
                  goto LAB_00603174;
                }
                if ((N_Scol_precision[0] != N_Scol_precision[local_240]) ||
                   (NAN(N_Scol_precision[0]) || NAN(N_Scol_precision[local_240]))) {
                  line_number = 0x1a6;
                  local_200 = "x,y,z S column precisions are not identical.";
                  goto LAB_00603174;
                }
                dVar16 = N_vertex_point_precision[0];
                if (N_vertex_point_precision[0] <= local_238) {
                  dVar16 = local_238;
                }
                local_1f8[local_230]->m_P[local_240] = 0.0;
                dVar17 = N_outer_point_precision[0];
                if (N_outer_point_precision[0] <= dVar16) {
                  dVar17 = dVar16;
                }
                local_240 = uVar11;
                local_238 = N_Scol_precision[0];
                if (N_Scol_precision[0] <= dVar17) {
                  local_238 = dVar17;
                }
              }
            }
LAB_0060310a:
            ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&_ringP1);
            ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&_ringP0);
          }
          ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&component_ring_array);
        }
        else {
          ON_SubDIncrementErrorCount();
          local_238 = -1.23432101234321e+308;
        }
        ON_SimpleArray<const_ON_SubDVertex_*>::~ON_SimpleArray(&vertex_ring_array);
        goto LAB_00602b09;
      }
      ON_SubDIncrementErrorCount();
    }
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  local_238 = -1.23432101234321e+308;
LAB_00602b09:
  ON_SubD::~ON_SubD(&subd);
  ON_SimpleArray<double>::~ON_SimpleArray(&_Scol);
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&_P);
  return local_238;
}

Assistant:

double ON_SubDMatrix::TestEvaluation() const
{
  if ( nullptr == m_S || m_R < 3 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (!m_sector_type.IsValid())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int F = m_sector_type.FaceCount();
  if (0 == F)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int N = m_sector_type.EdgeCount();
  if (0 == N)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int R = m_sector_type.PointRingCount();
  if (0 == R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (R != m_R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  const unsigned f_edge_count = m_sector_type.FacetEdgeCount();
  if (0 == f_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = TestMatrix();
  const double*const* S = m_S;
  
  unsigned int SP_low_precision_index = ON_UNSET_UINT_INDEX;
  
  ON_SimpleArray< ON_3dPoint > _P(R);
  ON_3dPoint* SP = _P.Array();

  ON_SimpleArray< double > _Scol(R);
  double* Scol = _Scol.Array();

  ON_SubD subd;
  if (&subd != m_sector_type.SectorRingSubD(0.0,0.0,&subd))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex* vertex0 = subd.FirstVertex();
  if (nullptr == vertex0)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (N != vertex0->m_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (F != vertex0->m_face_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  ON_SubDSectorIterator sit;
  if ( nullptr == sit.Initialize(vertex0) )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  ON_SimpleArray<const ON_SubDVertex*> vertex_ring_array(subd.VertexCount());
  for (const ON_SubDVertex* vertex = vertex0; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    vertex_ring_array.Append(vertex);
  }
  if ( R != vertex_ring_array.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex*const* vertex_ring = vertex_ring_array.Array();

  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  const unsigned int component_ring_count = ON_SubD::GetSectorComponentRing(sit,component_ring_array);
  if ( component_ring_count < 4 || component_ring_count != m_sector_type.ComponentRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDComponentPtr* component_ring = component_ring_array.Array();

  ON_SimpleArray< ON_3dPoint > _ringP0;

  ON_SimpleArray< ON_3dPoint > _ringP1;

  for (unsigned int vi = 0; vi < R; vi++)
    Scol[vi] = ON_DBL_QNAN;

  for (unsigned int vi = 0; vi < R; vi++)
  {
    double N_vertex_point_precision[3] = { 0 };
    double N_outer_point_precision[3] = { 0 };
    double N_Scol_precision[3] = { 0 };

    for (unsigned int Pi = 0; Pi < 3; Pi++)
    {
      if (false == ClearCachedPoints(component_ring_count,component_ring))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 1.0;

      if ( R != ON_SubD::GetSectorPointRing(false,component_ring_count,component_ring,_ringP0))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP0 = _ringP0.Array();

      // vertex_ring[]->m_P and ringP0[] should be same point lists
      for (unsigned int i = 0; i < R; i++)
      {
        if (0.0 == ringP0[i][(Pi+1)%3] && 0.0 == ringP0[i][(Pi+2)%3])
        {
          if ( ringP0[i][Pi] == ((i == vi) ? 1.0 : 0.0) )
            continue;
        }
        // vertex_ring[] is not in the expected order or
        // there is a bug in ON_SubD::GetSectorPointRing
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if ( R != ON_SubD::GetSectorSubdivisionPointRing(component_ring, component_ring_count,_ringP1))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP1 = _ringP1.Array();

      for (unsigned int i = 0; i < R; i++)
      {
        SP[i] = ON_3dPoint::Origin;
        for (unsigned int j = 0; j < R; j++)
        {
          SP[i] += S[i][j] * ringP0[j];
        }
      }

      if (!(SP[vi][Pi] > 0.0))
      {
        // ON_ERROR("SP[vi][Pi] is not positive.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (false == TestPoint(SP, 0, ringP1[0], Pi, N_vertex_point_precision, &SP_low_precision_index))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      for (unsigned int j = 1; j < R; j++)
      {
        if (false == TestPoint(SP, j, ringP1[j], Pi, N_outer_point_precision, &SP_low_precision_index))
          return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      for (unsigned int i = 0; i < R; i++)
      {
        double d = fabs(S[i][vi] - ringP1[i][Pi]);
        if (d > N_Scol_precision[Pi])
          N_Scol_precision[Pi] = d;
      }

      if (!(N_vertex_point_precision[0] == N_vertex_point_precision[Pi]))
      {
        ON_ERROR("x,y,z vertex point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_outer_point_precision[0] == N_outer_point_precision[Pi]))
      {
        ON_ERROR("x,y,z outer point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_Scol_precision[0] == N_Scol_precision[Pi]))
      {
        ON_ERROR("x,y,z S column precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (rc < N_vertex_point_precision[0])
        rc = N_vertex_point_precision[0];
      if (rc < N_outer_point_precision[0])
        rc = N_outer_point_precision[0];
      if (rc < N_Scol_precision[0])
        rc = N_Scol_precision[0];

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 0.0;
    }
  }

  return rc; // basic tests passed.
}